

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::internal::(anonymous_namespace)::InternalFeatureHelperTest_GetResolvedSourceFeatureExtension_Test>
::CreateTest(TestFactoryImpl<google::protobuf::internal::(anonymous_namespace)::InternalFeatureHelperTest_GetResolvedSourceFeatureExtension_Test>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x88);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__InternalFeatureHelperTest_0189c920;
  google::protobuf::DescriptorPool::DescriptorPool((DescriptorPool *)(this_00 + 1));
  this_00->_vptr_Test = (_func_int **)&PTR__InternalFeatureHelperTest_0189c738;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }